

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O1

int VP8ProcessRow(VP8Decoder *dec,VP8Io *io)

{
  VP8MBData *pVVar1;
  VP8FInfo *pVVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  WebPWorkerInterface *pWVar7;
  uint uVar8;
  
  if ((dec->filter_type < 1) || (dec->mb_y < dec->tl_mb_y)) {
    bVar3 = false;
  }
  else {
    bVar3 = dec->mb_y <= dec->br_mb_y;
  }
  uVar8 = (uint)bVar3;
  if (dec->mt_method != 0) {
    pWVar7 = WebPGetWorkerInterface();
    uVar4 = (*pWVar7->Sync)(&dec->worker);
    if ((uVar4 & 1) != 0) {
      memcpy(&(dec->thread_ctx).io,io,0xa0);
      iVar5 = dec->mt_method;
      (dec->thread_ctx).id = dec->cache_id;
      (dec->thread_ctx).mb_y = dec->mb_y;
      (dec->thread_ctx).filter_row = uVar8;
      if (iVar5 == 2) {
        pVVar1 = (dec->thread_ctx).mb_data;
        (dec->thread_ctx).mb_data = dec->mb_data;
        dec->mb_data = pVVar1;
      }
      else {
        ReconstructRow(dec,&dec->thread_ctx);
      }
      if (uVar8 != 0) {
        pVVar2 = (dec->thread_ctx).f_info;
        (dec->thread_ctx).f_info = dec->f_info;
        dec->f_info = pVVar2;
      }
      pWVar7 = WebPGetWorkerInterface();
      (*pWVar7->Launch)(&dec->worker);
      iVar6 = dec->cache_id + 1;
      iVar5 = 0;
      if (iVar6 != dec->num_caches) {
        iVar5 = iVar6;
      }
      dec->cache_id = iVar5;
    }
    return uVar4 & 1;
  }
  (dec->thread_ctx).mb_y = dec->mb_y;
  (dec->thread_ctx).filter_row = uVar8;
  ReconstructRow(dec,&dec->thread_ctx);
  iVar5 = FinishRow(dec,io);
  return iVar5;
}

Assistant:

int VP8ProcessRow(VP8Decoder* const dec, VP8Io* const io) {
  int ok = 1;
  VP8ThreadContext* const ctx = &dec->thread_ctx;
  const int filter_row =
      (dec->filter_type > 0) &&
      (dec->mb_y >= dec->tl_mb_y) && (dec->mb_y <= dec->br_mb_y);
  if (dec->mt_method == 0) {
    // ctx->id and ctx->f_info are already set
    ctx->mb_y = dec->mb_y;
    ctx->filter_row = filter_row;
    ReconstructRow(dec, ctx);
    ok = FinishRow(dec, io);
  } else {
    WebPWorker* const worker = &dec->worker;
    // Finish previous job *before* updating context
    ok &= WebPGetWorkerInterface()->Sync(worker);
    assert(worker->status == OK);
    if (ok) {   // spawn a new deblocking/output job
      ctx->io = *io;
      ctx->id = dec->cache_id;
      ctx->mb_y = dec->mb_y;
      ctx->filter_row = filter_row;
      if (dec->mt_method == 2) {  // swap macroblock data
        VP8MBData* const tmp = ctx->mb_data;
        ctx->mb_data = dec->mb_data;
        dec->mb_data = tmp;
      } else {
        // perform reconstruction directly in main thread
        ReconstructRow(dec, ctx);
      }
      if (filter_row) {            // swap filter info
        VP8FInfo* const tmp = ctx->f_info;
        ctx->f_info = dec->f_info;
        dec->f_info = tmp;
      }
      // (reconstruct)+filter in parallel
      WebPGetWorkerInterface()->Launch(worker);
      if (++dec->cache_id == dec->num_caches) {
        dec->cache_id = 0;
      }
    }
  }
  return ok;
}